

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **args)

{
  char *__name;
  bool bVar1;
  ostream *poVar2;
  dirent *pdVar3;
  value_type local_228;
  stringstream local_208 [8];
  stringstream path;
  ostream local_1f8 [376];
  undefined4 local_80;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string name;
  dirent *dirent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  DIR *dir;
  char *dirName;
  char **args_local;
  int argc_local;
  
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: MP3Encoder <directory name>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    args_local._4_4_ = 1;
  }
  else {
    __name = args[1];
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)opendir(__name);
    if (paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to open directory ");
      poVar2 = std::operator<<(poVar2,__name);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      args_local._4_4_ = 1;
    }
    else {
      memset(&dirent,0,0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&dirent);
      while (pdVar3 = readdir((DIR *)paths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
            pdVar3 != (dirent *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_78,pdVar3->d_name,&local_79);
        std::allocator<char>::~allocator(&local_79);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_78,".");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_78,".."), bVar1)) {
          local_80 = 3;
        }
        else {
          std::__cxx11::stringstream::stringstream(local_208);
          poVar2 = std::operator<<(local_1f8,__name);
          poVar2 = std::operator<<(poVar2,"/");
          std::operator<<(poVar2,(string *)local_78);
          std::__cxx11::stringstream::str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&dirent,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::stringstream::~stringstream(local_208);
          local_80 = 0;
        }
        std::__cxx11::string::~string((string *)local_78);
      }
      closedir((DIR *)paths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      mp3_encoder::parallel_encoder::run
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dirent);
      args_local._4_4_ = 0;
      local_80 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dirent);
    }
  }
  return args_local._4_4_;
}

Assistant:

int main(int argc, char** args)
{
    if (argc < 2)
    {
        std::cerr << "Usage: MP3Encoder <directory name>" << std::endl;
        return 1;
    }

    auto const dirName = args[1];
    auto const dir = opendir(dirName);
    if (!dir)
    {
        std::cerr << "Failed to open directory " << dirName << std::endl;
        return 1;
    }

    auto paths = std::vector<std::string>{};

    for (dirent* dirent = nullptr; (dirent = readdir(dir)) != nullptr;)
    {
        auto const name = std::string{dirent->d_name};
        if ((name == ".") || (name == ".."))
        {
            continue;
        }

        auto path = std::stringstream{};
        path << dirName << "/" << name;

        paths.push_back(path.str());
    }

    closedir(dir);

    mp3_encoder::parallel_encoder::run(paths);

    return 0;
}